

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

void __thiscall
Am_Object_Data::delete_slot(Am_Object_Data *this,Am_Slot_Data *slot,Am_Slot_Data *proto_slot)

{
  bool bVar1;
  ushort uVar2;
  Am_Inherit_Rule rule;
  Am_Value_Type type;
  Am_Slot_Data *proto_slot_local;
  Am_Slot_Data *slot_local;
  Am_Object_Data *this_local;
  
  if (proto_slot == (Am_Slot_Data *)0x0) {
    if ((slot->super_Am_Value).type != 0x1002) {
      propagate_change(this,slot->key,(Am_Constraint *)0x0,&slot->super_Am_Value,&Missing_Slot_Value
                      );
    }
  }
  else {
    uVar2 = *(ushort *)&proto_slot->field_0x38 >> 8 & 3;
    if ((uVar2 != 0) && (uVar2 != 3)) {
      *(ushort *)&proto_slot->field_0x38 =
           *(ushort *)&proto_slot->field_0x38 & 0xff00 |
           *(ushort *)&proto_slot->field_0x38 & 0xff | 1;
    }
    if (((*(ushort *)&slot->field_0x38 >> 8 & 3) == 2) || (uVar2 == 2)) {
      sever_copies(this,slot);
    }
    else if (((((*(ushort *)&slot->field_0x38 >> 8 & 3) == 1) && (uVar2 == 1)) &&
             (bVar1 = Am_Value::operator!=(&slot->super_Am_Value,&proto_slot->super_Am_Value), bVar1
             )) && (bVar1 = propagate_change(this,slot->key,(Am_Constraint *)0x0,
                                             &slot->super_Am_Value,&proto_slot->super_Am_Value),
                   bVar1)) {
      *(ushort *)&proto_slot->field_0x38 =
           *(ushort *)&proto_slot->field_0x38 & 0xff00 | *(ushort *)&proto_slot->field_0x38 & 0xfe;
    }
  }
  Am_Slot_Data::Destroy(slot);
  return;
}

Assistant:

void
Am_Object_Data::delete_slot(Am_Slot_Data *slot, Am_Slot_Data *proto_slot)
{
  Am_Value_Type type = (Am_Value_Type)slot->type;
  if (proto_slot) {
    Am_Inherit_Rule rule = (Am_Inherit_Rule)proto_slot->rule;
    if ((rule != Am_LOCAL) && (rule != Am_STATIC))
      proto_slot->flags |= BIT_IS_INHERITED;
    if ((slot->rule == Am_COPY) || (rule == Am_COPY))
      sever_copies(slot);
    else if ((slot->rule == Am_INHERIT) && (rule == Am_INHERIT)) {
#if 1 // propagate all changes
      if (*slot != *proto_slot)
#endif
        if (propagate_change(slot->key, nullptr, *slot, *proto_slot))
          proto_slot->flags &= ~BIT_IS_INHERITED;
    }
  } else if (type != Am_MISSING_SLOT)
    (void)propagate_change(slot->key, nullptr, *slot, Missing_Slot_Value);
  slot->Destroy();
}